

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00m2.cpp
# Opt level: O2

int main(void)

{
  int *piVar1;
  pointer pmVar2;
  int iVar3;
  istream *piVar4;
  iterator __position;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  iterator __begin3;
  int *piVar8;
  char *pcVar9;
  int i_1;
  int iVar10;
  int i;
  long lVar11;
  vector<int,_std::allocator<int>_> *x;
  long lVar12;
  pointer pvVar13;
  int I;
  int U;
  ulong local_c0;
  int P;
  int A;
  int M;
  int N;
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
  pq;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  user_winnings;
  vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  vm;
  value_type local_50;
  vector<int,_std::allocator<int>_> v;
  
  lVar12 = 0;
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x1071a8) = 0;
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&N);
  piVar4 = (istream *)std::istream::operator>>(piVar4,&M);
  std::istream::operator>>(piVar4,&A);
  std::vector<int,_std::allocator<int>_>::vector(&v,(long)N,(allocator_type *)&pq);
  for (lVar11 = 0; lVar11 < N; lVar11 = lVar11 + 1) {
    std::istream::operator>>
              ((istream *)&std::cin,
               (int *)((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar12));
    lVar12 = lVar12 + 4;
  }
  std::
  vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::vector(&vm,(long)N,(allocator_type *)&pq);
  for (iVar10 = 0; iVar10 < A; iVar10 = iVar10 + 1) {
    std::operator>>((istream *)&std::cin,(char *)&user_winnings);
    if ((char)user_winnings.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 'B') {
      piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&U);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&I);
      std::istream::operator>>(piVar4,&P);
      iVar3 = P;
      pq.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(pq.c.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,U + -1);
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](vm.
                          super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)I + -1,(key_type *)&pq);
      *pmVar5 = iVar3;
    }
    else if ((char)user_winnings.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 'W') {
      piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&U);
      std::istream::operator>>(piVar4,&I);
      pq.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(pq.c.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,U + -1);
      __position = std::
                   _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   ::find(&vm.
                           super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)I + -1]._M_t,
                          (key_type *)&pq);
      if ((_Rb_tree_header *)__position._M_node !=
          &vm.
           super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)I + -1]._M_t._M_impl.
           super__Rb_tree_header) {
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                            *)(vm.
                               super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + (long)I + -1),__position)
        ;
      }
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&user_winnings,(long)M,(allocator_type *)&pq);
  local_c0 = 0;
  while( true ) {
    if ((ulong)(((long)vm.
                       super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)vm.
                      super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= local_c0) break;
    pq.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pq.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pq.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pmVar2 = vm.
             super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_c0;
    for (p_Var6 = vm.
                  super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_c0]._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      local_50.second = p_Var6[1]._M_color;
      local_50.first = *(int *)&p_Var6[1].field_0x4;
      std::
      priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
      ::push(&pq,&local_50);
    }
    while ((pq.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            pq.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish &&
           (0 < v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[local_c0]))) {
      std::vector<int,std::allocator<int>>::emplace_back<unsigned_long&>
                ((vector<int,std::allocator<int>> *)
                 ((long)(pq.c.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->second * 0x18 +
                 CONCAT71(user_winnings.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                          (char)user_winnings.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)),&local_c0);
      std::
      priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
      ::pop(&pq);
      v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [local_c0] = v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_c0] + -1;
    }
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&pq);
    local_c0 = local_c0 + 1;
  }
  for (pvVar13 = (pointer)CONCAT71(user_winnings.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   (char)user_winnings.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
      pvVar13 !=
      user_winnings.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pvVar13 = pvVar13 + 1) {
    piVar8 = (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (pvVar13->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar9 = "NONE\n";
    if (piVar1 != piVar8) {
      for (; piVar8 != piVar1; piVar8 = piVar8 + 1) {
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar8 + 1);
        std::operator<<(poVar7," ");
      }
      pcVar9 = "\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar9);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&user_winnings);
  std::
  vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::~vector(&vm);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&v.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int N, M, A;
    cin >> N >> M >> A;
    vector<int> v(N);
    for (int i = 0; i < N; ++i) {
        cin >> v[i];
    }
    int U, I, P;
    vector<map<int, int>> vm(N);
    for (int i = 0; i < A; ++i) {
        char action;
        cin >> action;
        switch (action) {
        case 'B':
            cin >> U >> I >> P;
            vm[I - 1][U - 1] = P;
            break;
        case 'W':
            cin >> U >> I;
            auto it = vm[I - 1].find(U - 1);
            if (it != vm[I - 1].end()) {
                vm[I - 1].erase(it);
            }
            break;
        }
    }
    vector<vector<int>> user_winnings(M);
    for (size_t e = 0; e < vm.size(); e++) {
        priority_queue<pii> pq;
        for (auto &k : vm[e]) {
            pq.push(make_pair(k.second, k.first));
        }
        while (!pq.empty() && v[e] > 0) {
            user_winnings[pq.top().second].emplace_back(e);
            pq.pop();
            v[e]--;
        }
    }
    for (auto &x : user_winnings) {
        if (x.size() > 0) {
            for (auto &y : x) {
                cout << y + 1 << " ";
            }
            cout << "\n";
        } else {
            cout << "NONE\n";
        }
    }
}